

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O0

int dBoxBox2(btVector3 *p1,btScalar *R1,btVector3 *side1,btVector3 *p2,btScalar *R2,btVector3 *side2
            ,btVector3 *normal,btScalar *depth,int *return_code,int maxc,dContactGeom *param_11,
            int param_12,Result *output)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  btScalar *pbVar5;
  btScalar *pbVar6;
  btVector3 *in_RCX;
  btVector3 *in_RDX;
  btScalar *in_RSI;
  btVector3 *in_RDI;
  btScalar *in_R8;
  btVector3 *in_R9;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  btScalar bVar10;
  btScalar bVar11;
  btScalar bVar12;
  btVector3 bVar13;
  btVector3 *in_stack_00000008;
  float *in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  btVector3 *in_stack_00000038;
  btVector3 posInWorld;
  int iret [8];
  btScalar maxdepth;
  int i1;
  btVector3 pointInWorld_2;
  btVector3 pointInWorld_1;
  btScalar k2_1;
  btScalar k1_1;
  int cnum;
  btScalar det1;
  btScalar dep [8];
  btScalar point [24];
  int n;
  btScalar ret [16];
  btScalar rect [2];
  btScalar k4;
  btScalar k3;
  btScalar k2;
  btScalar k1;
  btScalar m22;
  btScalar m21;
  btScalar m12;
  btScalar m11;
  btScalar c2;
  btScalar c1;
  btScalar quad [8];
  int code2;
  int code1;
  int codeN;
  btVector3 center;
  int a2;
  int a1;
  int lanr;
  btVector3 anr;
  btVector3 nr;
  btVector3 normal2;
  btScalar *Sb;
  btScalar *Sa;
  btScalar *pb;
  btScalar *pa;
  btScalar *Rb;
  btScalar *Ra;
  btVector3 pointInWorld;
  btVector3 ub;
  btVector3 ua;
  btScalar beta;
  btScalar alpha;
  btVector3 pb_1;
  btScalar sign;
  btVector3 pa_1;
  btScalar fudge2;
  int code;
  int invert_normal;
  int j;
  int i;
  btScalar l;
  btScalar s2;
  btScalar s;
  btScalar Q33;
  btScalar Q32;
  btScalar Q31;
  btScalar Q23;
  btScalar Q22;
  btScalar Q21;
  btScalar Q13;
  btScalar Q12;
  btScalar Q11;
  btScalar R33;
  btScalar R32;
  btScalar R31;
  btScalar R23;
  btScalar R22;
  btScalar R21;
  btScalar R13;
  btScalar R12;
  btScalar R11;
  btScalar B [3];
  btScalar A [3];
  btScalar *normalR;
  btVector3 normalC;
  btVector3 pp;
  btVector3 p;
  btScalar fudge_factor;
  btVector3 *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  float in_stack_fffffffffffff98c;
  btVector3 *in_stack_fffffffffffff990;
  btVector3 *pbVar14;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  btScalar *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  btVector3 *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  btScalar in_stack_fffffffffffffa10;
  btScalar in_stack_fffffffffffffa14;
  btScalar *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  btScalar local_3e8 [4];
  btScalar local_3d8 [4];
  btScalar local_3c8 [4];
  btVector3 local_3b8;
  int local_3a8 [10];
  float local_380;
  int local_37c;
  btScalar local_378 [4];
  btVector3 local_368;
  btScalar local_358 [4];
  btVector3 local_348;
  float local_338;
  float local_334;
  int local_330;
  float local_32c;
  float local_328 [8];
  float local_308 [27];
  int local_29c;
  float local_298 [16];
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  btScalar local_238;
  btScalar local_234;
  btScalar local_230;
  btScalar local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  int local_208;
  int local_204;
  int local_200;
  btVector3 local_1fc;
  int local_1ec;
  uint local_1e8;
  int local_1e4;
  btVector3 local_1e0;
  btVector3 local_1d0;
  btVector3 local_1c0;
  float *local_1b0;
  float *local_1a8;
  btScalar *local_1a0;
  btScalar *local_198;
  btScalar *local_190;
  btScalar *local_188;
  btScalar local_17c [4];
  btVector3 local_16c;
  btVector3 local_15c;
  btVector3 local_14c;
  float local_13c;
  float local_138;
  btVector3 local_134;
  float local_124;
  btVector3 local_120;
  undefined4 local_110;
  btScalar local_10c [4];
  int local_fc;
  uint local_f8;
  int local_f4;
  int local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  btScalar local_e0;
  btScalar local_dc;
  btScalar local_d8;
  btScalar local_d4;
  btScalar local_d0;
  btScalar local_cc;
  btScalar local_c8;
  btScalar local_c4;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  btScalar local_b4;
  btScalar local_b0;
  btScalar local_ac;
  btScalar local_a8;
  btScalar local_a4;
  btScalar local_a0;
  btScalar local_9c;
  float local_98 [4];
  float local_88;
  float local_84;
  btScalar *local_80;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btVector3 local_6c;
  btVector3 local_5c;
  btVector3 local_4c;
  undefined4 local_3c;
  btVector3 *local_38;
  btScalar *local_30;
  btVector3 *local_28;
  btVector3 *local_20;
  btScalar *local_18;
  btVector3 *local_10;
  int local_4;
  
  local_3c = 0x3f866666;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  btVector3::btVector3(&local_4c);
  btVector3::btVector3(&local_5c);
  local_70 = 0.0;
  local_74 = 0.0;
  local_78 = 0.0;
  btVector3::btVector3(&local_6c,&local_70,&local_74,&local_78);
  local_80 = (btScalar *)0x0;
  bVar13 = operator-(in_stack_fffffffffffff990,
                     (btVector3 *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  pbVar6 = local_18;
  local_10c._0_8_ = bVar13.m_floats._0_8_;
  local_4c.m_floats[0] = local_10c[0];
  local_4c.m_floats[1] = local_10c[1];
  local_10c._8_8_ = bVar13.m_floats._8_8_;
  local_4c.m_floats[2] = local_10c[2];
  local_4c.m_floats[3] = local_10c[3];
  local_10c = bVar13.m_floats;
  pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
  bVar7 = dDOT41(pbVar6,pbVar5);
  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
  *pbVar6 = bVar7;
  pbVar6 = local_18 + 1;
  pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
  bVar7 = dDOT41(pbVar6,pbVar5);
  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
  pbVar6[1] = bVar7;
  pbVar6 = local_18 + 2;
  pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
  bVar7 = dDOT41(pbVar6,pbVar5);
  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
  pbVar6[2] = bVar7;
  pbVar6 = btVector3::operator_cast_to_float_(local_20);
  local_98[3] = *pbVar6 * 0.5;
  pbVar6 = btVector3::operator_cast_to_float_(local_20);
  local_88 = pbVar6[1] * 0.5;
  pbVar6 = btVector3::operator_cast_to_float_(local_20);
  local_84 = pbVar6[2] * 0.5;
  pbVar6 = btVector3::operator_cast_to_float_(local_38);
  local_98[0] = *pbVar6 * 0.5;
  pbVar6 = btVector3::operator_cast_to_float_(local_38);
  local_98[1] = pbVar6[1] * 0.5;
  pbVar6 = btVector3::operator_cast_to_float_(local_38);
  local_98[2] = pbVar6[2] * 0.5;
  local_9c = dDOT44(local_18,local_30);
  local_a0 = dDOT44(local_18,local_30 + 1);
  local_a4 = dDOT44(local_18,local_30 + 2);
  local_a8 = dDOT44(local_18 + 1,local_30);
  local_ac = dDOT44(local_18 + 1,local_30 + 1);
  local_b0 = dDOT44(local_18 + 1,local_30 + 2);
  local_b4 = dDOT44(local_18 + 2,local_30);
  local_b8 = dDOT44(local_18 + 2,local_30 + 1);
  local_bc = dDOT44(local_18 + 2,local_30 + 2);
  local_c0 = btFabs(local_9c);
  local_c4 = btFabs(local_a0);
  local_c8 = btFabs(local_a4);
  local_cc = btFabs(local_a8);
  local_d0 = btFabs(local_ac);
  local_d4 = btFabs(local_b0);
  local_d8 = btFabs(local_b4);
  local_dc = btFabs(local_b8);
  local_e0 = btFabs(local_bc);
  local_e4 = -3.4028235e+38;
  local_f8 = 0;
  local_fc = 0;
  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
  bVar7 = btFabs(*pbVar6);
  local_e8 = bVar7 - (local_98[2] * local_c8 +
                     local_98[1] * local_c4 + local_98[0] * local_c0 + local_98[3]);
  if (local_e8 <= 0.0) {
    if (local_e4 < local_e8) {
      local_80 = local_18;
      local_e4 = local_e8;
      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
      local_f8 = (uint)(*pbVar6 <= 0.0 && *pbVar6 != 0.0);
      local_fc = 1;
    }
    pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
    bVar7 = btFabs(pbVar6[1]);
    local_e8 = bVar7 - (local_98[2] * local_d4 +
                       local_98[1] * local_d0 + local_98[0] * local_cc + local_88);
    if (local_e8 <= 0.0) {
      if (local_e4 < local_e8) {
        local_80 = local_18 + 1;
        local_e4 = local_e8;
        pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
        local_f8 = (uint)(pbVar6[1] <= 0.0 && pbVar6[1] != 0.0);
        local_fc = 2;
      }
      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
      bVar7 = btFabs(pbVar6[2]);
      local_e8 = bVar7 - (local_98[2] * local_e0 +
                         local_98[1] * local_dc + local_98[0] * local_d8 + local_84);
      if (local_e8 <= 0.0) {
        if (local_e4 < local_e8) {
          local_80 = local_18 + 2;
          local_e4 = local_e8;
          pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
          local_f8 = (uint)(pbVar6[2] <= 0.0 && pbVar6[2] != 0.0);
          local_fc = 3;
        }
        pbVar6 = local_30;
        pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
        bVar7 = dDOT41(pbVar6,pbVar5);
        bVar7 = btFabs(bVar7);
        pbVar6 = local_30;
        local_e8 = bVar7 - (local_84 * local_d8 + local_98[3] * local_c0 + local_88 * local_cc +
                           local_98[0]);
        if (local_e8 <= 0.0) {
          if (local_e4 < local_e8) {
            local_80 = local_30;
            local_e4 = local_e8;
            pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
            bVar7 = dDOT41(pbVar6,pbVar5);
            local_f8 = (uint)(bVar7 < 0.0);
            local_fc = 4;
          }
          pbVar6 = local_30 + 1;
          pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
          bVar7 = dDOT41(pbVar6,pbVar5);
          bVar7 = btFabs(bVar7);
          local_e8 = bVar7 - (local_84 * local_dc + local_98[3] * local_c4 + local_88 * local_d0 +
                             local_98[1]);
          if (local_e8 <= 0.0) {
            if (local_e4 < local_e8) {
              local_80 = local_30 + 1;
              pbVar6 = local_30 + 1;
              local_e4 = local_e8;
              pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
              bVar7 = dDOT41(pbVar6,pbVar5);
              local_f8 = (uint)(bVar7 < 0.0);
              local_fc = 5;
            }
            pbVar6 = local_30 + 2;
            pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
            bVar7 = dDOT41(pbVar6,pbVar5);
            bVar7 = btFabs(bVar7);
            local_e8 = bVar7 - (local_84 * local_e0 + local_98[3] * local_c8 + local_88 * local_d4 +
                               local_98[2]);
            if (local_e8 <= 0.0) {
              if (local_e4 < local_e8) {
                local_80 = local_30 + 2;
                pbVar6 = local_30 + 2;
                local_e4 = local_e8;
                pbVar5 = btVector3::operator_cast_to_float_(&local_4c);
                bVar7 = dDOT41(pbVar6,pbVar5);
                local_f8 = (uint)(bVar7 < 0.0);
                local_fc = 6;
              }
              local_110 = 0x3727c5ac;
              local_c0 = local_c0 + 1e-05;
              local_c4 = local_c4 + 1e-05;
              local_c8 = local_c8 + 1e-05;
              local_cc = local_cc + 1e-05;
              local_d0 = local_d0 + 1e-05;
              local_d4 = local_d4 + 1e-05;
              local_d8 = local_d8 + 1e-05;
              local_dc = local_dc + 1e-05;
              local_e0 = local_e0 + 1e-05;
              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
              bVar7 = local_a8;
              fVar8 = pbVar6[2];
              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
              bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[1] * local_b4));
              local_e8 = bVar7 - (local_98[2] * local_c4 +
                                 local_98[1] * local_c8 + local_88 * local_d8 + local_84 * local_cc)
              ;
              if (local_e8 <= 1.1920929e-07) {
                local_ec = btSqrt(0.0);
                if ((1.1920929e-07 < local_ec) &&
                   (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                  local_80 = (btScalar *)0x0;
                  fVar8 = 0.0 / local_ec;
                  local_e4 = local_e8;
                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                  *pbVar6 = fVar8;
                  fVar8 = -local_b4 / local_ec;
                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                  pbVar6[1] = fVar8;
                  fVar8 = local_a8 / local_ec;
                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                  pbVar6[2] = fVar8;
                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                  bVar7 = local_a8;
                  fVar8 = pbVar6[2];
                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                  local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[1] * local_b4) < 0.0);
                  local_fc = 7;
                }
                pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                bVar7 = local_ac;
                fVar8 = pbVar6[2];
                pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[1] * local_b8));
                local_e8 = bVar7 - (local_98[2] * local_c0 +
                                   local_98[0] * local_c8 +
                                   local_88 * local_dc + local_84 * local_d0);
                if (local_e8 <= 1.1920929e-07) {
                  local_ec = btSqrt(0.0);
                  if ((1.1920929e-07 < local_ec) &&
                     (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                    local_80 = (btScalar *)0x0;
                    fVar8 = 0.0 / local_ec;
                    local_e4 = local_e8;
                    pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                    *pbVar6 = fVar8;
                    fVar8 = -local_b8 / local_ec;
                    pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                    pbVar6[1] = fVar8;
                    fVar8 = local_ac / local_ec;
                    pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                    pbVar6[2] = fVar8;
                    pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                    bVar7 = local_ac;
                    fVar8 = pbVar6[2];
                    pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                    local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[1] * local_b8) < 0.0);
                    local_fc = 8;
                  }
                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                  bVar7 = local_b0;
                  fVar8 = pbVar6[2];
                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                  bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[1] * local_bc));
                  local_e8 = bVar7 - (local_98[1] * local_c0 +
                                     local_98[0] * local_c4 +
                                     local_88 * local_e0 + local_84 * local_d4);
                  if (local_e8 <= 1.1920929e-07) {
                    local_ec = btSqrt(0.0);
                    if ((1.1920929e-07 < local_ec) &&
                       (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                      local_80 = (btScalar *)0x0;
                      fVar8 = 0.0 / local_ec;
                      local_e4 = local_e8;
                      pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                      *pbVar6 = fVar8;
                      fVar8 = -local_bc / local_ec;
                      pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                      pbVar6[1] = fVar8;
                      fVar8 = local_b0 / local_ec;
                      pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                      pbVar6[2] = fVar8;
                      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                      bVar7 = local_b0;
                      fVar8 = pbVar6[2];
                      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                      local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[1] * local_bc) < 0.0);
                      local_fc = 9;
                    }
                    pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                    bVar7 = local_b4;
                    fVar8 = *pbVar6;
                    pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                    bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[2] * local_9c));
                    local_e8 = bVar7 - (local_98[2] * local_d0 +
                                       local_98[1] * local_d4 +
                                       local_98[3] * local_d8 + local_84 * local_c0);
                    if (local_e8 <= 1.1920929e-07) {
                      local_ec = btSqrt(0.0);
                      if ((1.1920929e-07 < local_ec) &&
                         (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                        local_80 = (btScalar *)0x0;
                        fVar8 = local_b4 / local_ec;
                        local_e4 = local_e8;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                        *pbVar6 = fVar8;
                        fVar8 = 0.0 / local_ec;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                        pbVar6[1] = fVar8;
                        fVar8 = -local_9c / local_ec;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                        pbVar6[2] = fVar8;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                        bVar7 = local_b4;
                        fVar8 = *pbVar6;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                        local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[2] * local_9c) < 0.0);
                        local_fc = 10;
                      }
                      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                      bVar7 = local_b8;
                      fVar8 = *pbVar6;
                      pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                      bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[2] * local_a0));
                      local_e8 = bVar7 - (local_98[2] * local_cc +
                                         local_98[0] * local_d4 +
                                         local_98[3] * local_dc + local_84 * local_c4);
                      if (local_e8 <= 1.1920929e-07) {
                        local_ec = btSqrt(0.0);
                        if ((1.1920929e-07 < local_ec) &&
                           (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                          local_80 = (btScalar *)0x0;
                          fVar8 = local_b8 / local_ec;
                          local_e4 = local_e8;
                          pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                          *pbVar6 = fVar8;
                          fVar8 = 0.0 / local_ec;
                          pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                          pbVar6[1] = fVar8;
                          fVar8 = -local_a0 / local_ec;
                          pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                          pbVar6[2] = fVar8;
                          pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                          bVar7 = local_b8;
                          fVar8 = *pbVar6;
                          pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                          local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[2] * local_a0) < 0.0);
                          local_fc = 0xb;
                        }
                        pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                        bVar7 = local_bc;
                        fVar8 = *pbVar6;
                        pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                        bVar7 = btFabs(fVar8 * bVar7 + -(pbVar6[2] * local_a4));
                        local_e8 = bVar7 - (local_98[1] * local_cc +
                                           local_98[0] * local_d0 +
                                           local_98[3] * local_e0 + local_84 * local_c8);
                        if (local_e8 <= 1.1920929e-07) {
                          local_ec = btSqrt(0.0);
                          if ((1.1920929e-07 < local_ec) &&
                             (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                            local_80 = (btScalar *)0x0;
                            fVar8 = local_bc / local_ec;
                            local_e4 = local_e8;
                            pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                            *pbVar6 = fVar8;
                            fVar8 = 0.0 / local_ec;
                            pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                            pbVar6[1] = fVar8;
                            fVar8 = -local_a4 / local_ec;
                            pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                            pbVar6[2] = fVar8;
                            pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                            bVar7 = local_bc;
                            fVar8 = *pbVar6;
                            pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                            local_f8 = (uint)(fVar8 * bVar7 + -(pbVar6[2] * local_a4) < 0.0);
                            local_fc = 0xc;
                          }
                          pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                          bVar7 = local_9c;
                          fVar8 = pbVar6[1];
                          pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                          bVar7 = btFabs(fVar8 * bVar7 + -(*pbVar6 * local_a8));
                          local_e8 = bVar7 - (local_98[2] * local_dc +
                                             local_98[1] * local_e0 +
                                             local_98[3] * local_cc + local_88 * local_c0);
                          if (local_e8 <= 1.1920929e-07) {
                            local_ec = btSqrt(0.0);
                            if ((1.1920929e-07 < local_ec) &&
                               (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                              local_80 = (btScalar *)0x0;
                              fVar8 = -local_a8 / local_ec;
                              local_e4 = local_e8;
                              pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                              *pbVar6 = fVar8;
                              fVar8 = local_9c / local_ec;
                              pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                              pbVar6[1] = fVar8;
                              fVar8 = 0.0 / local_ec;
                              pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                              pbVar6[2] = fVar8;
                              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                              bVar7 = local_9c;
                              fVar8 = pbVar6[1];
                              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                              local_f8 = (uint)(fVar8 * bVar7 + -(*pbVar6 * local_a8) < 0.0);
                              local_fc = 0xd;
                            }
                            pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                            bVar7 = local_a0;
                            fVar8 = pbVar6[1];
                            pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                            bVar7 = btFabs(fVar8 * bVar7 + -(*pbVar6 * local_ac));
                            local_e8 = bVar7 - (local_98[2] * local_d8 +
                                               local_98[0] * local_e0 +
                                               local_98[3] * local_d0 + local_88 * local_c4);
                            if (local_e8 <= 1.1920929e-07) {
                              local_ec = btSqrt(0.0);
                              if ((1.1920929e-07 < local_ec) &&
                                 (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                                local_80 = (btScalar *)0x0;
                                fVar8 = -local_ac / local_ec;
                                local_e4 = local_e8;
                                pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                *pbVar6 = fVar8;
                                fVar8 = local_a0 / local_ec;
                                pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                pbVar6[1] = fVar8;
                                fVar8 = 0.0 / local_ec;
                                pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                pbVar6[2] = fVar8;
                                pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                                bVar7 = local_a0;
                                fVar8 = pbVar6[1];
                                pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                                local_f8 = (uint)(fVar8 * bVar7 + -(*pbVar6 * local_ac) < 0.0);
                                local_fc = 0xe;
                              }
                              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                              bVar7 = local_a4;
                              fVar8 = pbVar6[1];
                              pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                              bVar7 = btFabs(fVar8 * bVar7 + -(*pbVar6 * local_b0));
                              local_e8 = bVar7 - (local_98[1] * local_d8 +
                                                 local_98[0] * local_dc +
                                                 local_98[3] * local_d4 + local_88 * local_c8);
                              if (local_e8 <= 1.1920929e-07) {
                                local_ec = btSqrt(0.0);
                                if ((1.1920929e-07 < local_ec) &&
                                   (local_e8 = local_e8 / local_ec, local_e4 < local_e8 * 1.05)) {
                                  local_80 = (btScalar *)0x0;
                                  fVar8 = -local_b0 / local_ec;
                                  local_e4 = local_e8;
                                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                  *pbVar6 = fVar8;
                                  fVar8 = local_a4 / local_ec;
                                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                  pbVar6[1] = fVar8;
                                  fVar8 = 0.0 / local_ec;
                                  pbVar6 = btVector3::operator_cast_to_float_(&local_6c);
                                  pbVar6[2] = fVar8;
                                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                                  bVar7 = local_a4;
                                  fVar8 = pbVar6[1];
                                  pbVar6 = btVector3::operator_cast_to_float_(&local_5c);
                                  local_f8 = (uint)(fVar8 * bVar7 + -(*pbVar6 * local_b0) < 0.0);
                                  local_fc = 0xf;
                                }
                                pbVar6 = local_18;
                                if (local_fc == 0) {
                                  local_4 = 0;
                                }
                                else {
                                  if (local_80 == (btScalar *)0x0) {
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_6c);
                                    bVar7 = dDOT(pbVar6,pbVar5);
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    *pbVar6 = bVar7;
                                    pbVar6 = local_18 + 4;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_6c);
                                    bVar7 = dDOT(pbVar6,pbVar5);
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[1] = bVar7;
                                    pbVar6 = local_18 + 8;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_6c);
                                    bVar7 = dDOT(pbVar6,pbVar5);
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[2] = bVar7;
                                  }
                                  else {
                                    bVar7 = *local_80;
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    *pbVar6 = bVar7;
                                    bVar7 = local_80[4];
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[1] = bVar7;
                                    bVar7 = local_80[8];
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[2] = bVar7;
                                  }
                                  if (local_f8 != 0) {
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    bVar7 = *pbVar6;
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    *pbVar6 = -bVar7;
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    bVar7 = pbVar6[1];
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[1] = -bVar7;
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    bVar7 = pbVar6[2];
                                    pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008);
                                    pbVar6[2] = -bVar7;
                                  }
                                  *in_stack_00000010 = -local_e4;
                                  if (local_fc < 7) {
                                    if (local_fc < 4) {
                                      local_188 = local_18;
                                      local_190 = local_30;
                                      local_198 = btVector3::operator_cast_to_float_(local_10);
                                      local_1a0 = btVector3::operator_cast_to_float_(local_28);
                                      local_1a8 = local_98 + 3;
                                      local_1b0 = local_98;
                                    }
                                    else {
                                      local_188 = local_30;
                                      local_190 = local_18;
                                      local_198 = btVector3::operator_cast_to_float_(local_28);
                                      local_1a0 = btVector3::operator_cast_to_float_(local_10);
                                      local_1a8 = local_98;
                                      local_1b0 = local_98 + 3;
                                    }
                                    btVector3::btVector3(&local_1c0);
                                    btVector3::btVector3(&local_1d0);
                                    btVector3::btVector3(&local_1e0);
                                    if (local_fc < 4) {
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = *pbVar6;
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      *pbVar6 = bVar7;
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      in_stack_fffffffffffffa10 = pbVar6[1];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      pbVar6[1] = in_stack_fffffffffffffa10;
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      in_stack_fffffffffffffa14 = pbVar6[2];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      pbVar6[2] = in_stack_fffffffffffffa14;
                                    }
                                    else {
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = *pbVar6;
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      *pbVar6 = -bVar7;
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = pbVar6[1];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      pbVar6[1] = -bVar7;
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = pbVar6[2];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_1c0);
                                      pbVar6[2] = -bVar7;
                                    }
                                    pbVar6 = local_190;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1c0);
                                    bVar7 = dDOT41(pbVar6,pbVar5);
                                    pbVar6 = btVector3::operator_cast_to_float_(&local_1d0);
                                    *pbVar6 = bVar7;
                                    pbVar6 = local_190 + 1;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1c0);
                                    bVar7 = dDOT41(pbVar6,pbVar5);
                                    pbVar6 = btVector3::operator_cast_to_float_(&local_1d0);
                                    pbVar6[1] = bVar7;
                                    pbVar6 = local_190 + 2;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1c0);
                                    bVar10 = dDOT41(pbVar6,pbVar5);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1d0);
                                    pbVar5[2] = bVar10;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1d0);
                                    bVar11 = btFabs(*pbVar5);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                    *pbVar5 = bVar11;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1d0);
                                    bVar11 = btFabs(pbVar5[1]);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                    pbVar5[1] = bVar11;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1d0);
                                    bVar12 = btFabs(pbVar5[2]);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                    pbVar5[2] = bVar12;
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                    fVar8 = pbVar5[1];
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                    if (fVar8 < *pbVar5 || fVar8 == *pbVar5) {
                                      pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                      fVar8 = *pbVar5;
                                      pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                      bVar3 = fVar8 == pbVar5[2];
                                      bVar4 = fVar8 < pbVar5[2];
                                      if (bVar4 || bVar3) {
                                        local_1ec = 1;
                                        local_1e4 = 2;
                                      }
                                      else {
                                        local_1e4 = 0;
                                        local_1ec = 2;
                                      }
                                      local_1e8 = (uint)(!bVar4 && !bVar3);
                                    }
                                    else {
                                      pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                      fVar8 = pbVar5[1];
                                      pbVar5 = btVector3::operator_cast_to_float_(&local_1e0);
                                      if (fVar8 < pbVar5[2] || fVar8 == pbVar5[2]) {
                                        local_1ec = 1;
                                        local_1e4 = 2;
                                      }
                                      else {
                                        local_1e4 = 1;
                                        local_1ec = 2;
                                      }
                                      local_1e8 = 0;
                                    }
                                    btVector3::btVector3(&local_1fc);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1d0);
                                    if (0.0 < pbVar5[local_1e4] || pbVar5[local_1e4] == 0.0) {
                                      for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                        fVar8 = local_1a0[local_f0];
                                        fVar9 = local_198[local_f0];
                                        fVar1 = local_1b0[local_1e4];
                                        fVar2 = local_190[local_f0 * 4 + local_1e4];
                                        pbVar5 = btVector3::operator_cast_to_float_(&local_1fc);
                                        pbVar5[local_f0] = -fVar1 * fVar2 + (fVar8 - fVar9);
                                      }
                                    }
                                    else {
                                      for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                        fVar8 = local_1a0[local_f0];
                                        fVar9 = local_198[local_f0];
                                        fVar1 = local_1b0[local_1e4];
                                        fVar2 = local_190[local_f0 * 4 + local_1e4];
                                        pbVar5 = btVector3::operator_cast_to_float_(&local_1fc);
                                        pbVar5[local_f0] = fVar1 * fVar2 + (fVar8 - fVar9);
                                      }
                                    }
                                    if (local_fc < 4) {
                                      local_200 = local_fc + -1;
                                    }
                                    else {
                                      local_200 = local_fc + -4;
                                    }
                                    if (local_200 == 0) {
                                      local_204 = 1;
                                      local_208 = 2;
                                    }
                                    else {
                                      if (local_200 == 1) {
                                        local_208 = 2;
                                      }
                                      else {
                                        local_208 = 1;
                                      }
                                      local_204 = 0;
                                    }
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1fc);
                                    local_22c = dDOT14(pbVar5,local_188 + local_204);
                                    pbVar5 = btVector3::operator_cast_to_float_(&local_1fc);
                                    local_230 = dDOT14(pbVar5,local_188 + local_208);
                                    local_234 = dDOT44(local_188 + local_204,
                                                       local_190 + (int)local_1e8);
                                    local_238 = dDOT44(local_188 + local_204,local_190 + local_1ec);
                                    local_23c = dDOT44(local_188 + local_208,
                                                       local_190 + (int)local_1e8);
                                    local_240 = dDOT44(local_188 + local_208,local_190 + local_1ec);
                                    local_244 = local_234 * local_1b0[(int)local_1e8];
                                    local_248 = local_23c * local_1b0[(int)local_1e8];
                                    local_24c = local_238 * local_1b0[local_1ec];
                                    local_250 = local_240 * local_1b0[local_1ec];
                                    local_228 = (local_22c - local_244) - local_24c;
                                    local_224 = (local_230 - local_248) - local_250;
                                    local_220 = (local_22c - local_244) + local_24c;
                                    local_21c = (local_230 - local_248) + local_250;
                                    local_218 = local_22c + local_244 + local_24c;
                                    local_214 = local_230 + local_248 + local_250;
                                    local_210 = (local_22c + local_244) - local_24c;
                                    local_20c = (local_230 + local_248) - local_250;
                                    local_258 = local_1a8[local_204];
                                    local_254 = local_1a8[local_208];
                                    local_29c = intersectRectQuad2((btScalar *)
                                                                   CONCAT44(
                                                  in_stack_fffffffffffffa24,
                                                  in_stack_fffffffffffffa20),
                                                  in_stack_fffffffffffffa18,
                                                  (btScalar *)
                                                  CONCAT44(in_stack_fffffffffffffa14,
                                                           in_stack_fffffffffffffa10));
                                    if (local_29c < 1) {
                                      local_4 = 0;
                                    }
                                    else {
                                      local_32c = 1.0 / (local_234 * local_240 +
                                                        -(local_238 * local_23c));
                                      local_234 = local_32c * local_234;
                                      local_238 = local_32c * local_238;
                                      local_23c = local_32c * local_23c;
                                      local_240 = local_32c * local_240;
                                      local_330 = 0;
                                      for (local_f4 = 0; local_f4 < local_29c;
                                          local_f4 = local_f4 + 1) {
                                        local_334 = local_240 *
                                                    (local_298[local_f4 << 1] - local_22c) +
                                                    -(local_238 *
                                                     (local_298[local_f4 * 2 + 1] - local_230));
                                        local_338 = -local_23c *
                                                    (local_298[local_f4 << 1] - local_22c) +
                                                    local_234 *
                                                    (local_298[local_f4 * 2 + 1] - local_230);
                                        for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                          pbVar5 = btVector3::operator_cast_to_float_(&local_1fc);
                                          local_308[local_330 * 3 + local_f0] =
                                               local_338 * local_190[local_f0 * 4 + local_1ec] +
                                               local_334 *
                                               local_190[(int)(local_f0 * 4 + local_1e8)] +
                                               pbVar5[local_f0];
                                        }
                                        fVar8 = local_1a8[local_200];
                                        pbVar5 = btVector3::operator_cast_to_float_(&local_1c0);
                                        bVar12 = dDOT(pbVar5,local_308 + local_330 * 3);
                                        local_328[local_330] = fVar8 - bVar12;
                                        if (0.0 <= local_328[local_330]) {
                                          local_298[local_330 << 1] = local_298[local_f4 << 1];
                                          local_298[local_330 * 2 + 1] = local_298[local_f4 * 2 + 1]
                                          ;
                                          local_330 = local_330 + 1;
                                        }
                                      }
                                      if (local_330 < 1) {
                                        local_4 = 0;
                                      }
                                      else {
                                        if (local_330 < in_stack_00000020) {
                                          in_stack_00000020 = local_330;
                                        }
                                        if (in_stack_00000020 < 1) {
                                          in_stack_00000020 = 1;
                                        }
                                        if (in_stack_00000020 < local_330) {
                                          local_37c = 0;
                                          local_380 = local_328[0];
                                          for (local_f0 = 1; local_f0 < local_330;
                                              local_f0 = local_f0 + 1) {
                                            if (local_380 < local_328[local_f0]) {
                                              local_380 = local_328[local_f0];
                                              local_37c = local_f0;
                                            }
                                          }
                                          cullPoints2((int)bVar11,
                                                      (btScalar *)
                                                      CONCAT44(bVar10,in_stack_fffffffffffff9e8),
                                                      (int)((ulong)pbVar6 >> 0x20),(int)pbVar6,
                                                      (int *)CONCAT44(bVar7,
                                                  in_stack_fffffffffffff9d8));
                                          for (local_f4 = 0; local_f4 < in_stack_00000020;
                                              local_f4 = local_f4 + 1) {
                                            btVector3::btVector3(&local_3b8);
                                            for (local_f0 = 0; pbVar14 = in_stack_00000038,
                                                local_f0 < 3; local_f0 = local_f0 + 1) {
                                              in_stack_fffffffffffff98c =
                                                   local_308[local_3a8[local_f4] * 3 + local_f0] +
                                                   local_198[local_f0];
                                              pbVar6 = btVector3::operator_cast_to_float_
                                                                 (&local_3b8);
                                              pbVar6[local_f0] = in_stack_fffffffffffff98c;
                                            }
                                            if (local_fc < 4) {
                                              in_stack_fffffffffffff980 = in_stack_00000038;
                                              local_3c8 = (btScalar  [4])
                                                          operator-(in_stack_00000038);
                                              (**(code **)(*(long *)in_stack_fffffffffffff980->
                                                                    m_floats + 0x20))
                                                        (-local_328[local_3a8[local_f4]],
                                                         in_stack_fffffffffffff980,local_3c8,
                                                         &local_3b8);
                                            }
                                            else {
                                              local_3d8 = (btScalar  [4])
                                                          operator-(in_stack_fffffffffffff980);
                                              operator*(in_stack_fffffffffffff990,
                                                        (btScalar *)
                                                        CONCAT44(in_stack_fffffffffffff98c,
                                                                 in_stack_fffffffffffff988));
                                              local_3e8 = (btScalar  [4])
                                                          operator-(in_stack_fffffffffffff990,
                                                                    (btVector3 *)
                                                                    CONCAT44(
                                                  in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
                                              (**(code **)(*(long *)pbVar14->m_floats + 0x20))
                                                        (-local_328[local_3a8[local_f4]],pbVar14,
                                                         local_3d8,local_3e8);
                                            }
                                          }
                                          local_330 = in_stack_00000020;
                                        }
                                        else if (local_fc < 4) {
                                          for (local_f4 = 0; local_f4 < local_330;
                                              local_f4 = local_f4 + 1) {
                                            btVector3::btVector3(&local_348);
                                            for (local_f0 = 0; pbVar14 = in_stack_00000038,
                                                local_f0 < 3; local_f0 = local_f0 + 1) {
                                              fVar8 = local_308[local_f4 * 3 + local_f0];
                                              fVar9 = local_198[local_f0];
                                              pbVar6 = btVector3::operator_cast_to_float_
                                                                 (&local_348);
                                              pbVar6[local_f0] = fVar8 + fVar9;
                                            }
                                            bVar13 = operator-(in_stack_fffffffffffff980);
                                            local_358[0] = bVar13.m_floats[0];
                                            local_358[1] = bVar13.m_floats[1];
                                            local_358[2] = bVar13.m_floats[2];
                                            local_358[3] = bVar13.m_floats[3];
                                            (**(code **)(*(long *)pbVar14->m_floats + 0x20))
                                                      (-local_328[local_f4],pbVar14,local_358,
                                                       &local_348);
                                          }
                                        }
                                        else {
                                          for (local_f4 = 0; local_f4 < local_330;
                                              local_f4 = local_f4 + 1) {
                                            btVector3::btVector3(&local_368);
                                            for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1
                                                ) {
                                              fVar8 = local_308[local_f4 * 3 + local_f0];
                                              fVar9 = local_198[local_f0];
                                              pbVar6 = btVector3::operator_cast_to_float_
                                                                 (in_stack_00000008);
                                              fVar1 = pbVar6[local_f0];
                                              fVar2 = local_328[local_f4];
                                              pbVar6 = btVector3::operator_cast_to_float_
                                                                 (&local_368);
                                              pbVar6[local_f0] = -fVar1 * fVar2 + fVar8 + fVar9;
                                            }
                                            pbVar14 = in_stack_00000038;
                                            bVar13 = operator-(in_stack_fffffffffffff980);
                                            local_378[0] = bVar13.m_floats[0];
                                            local_378[1] = bVar13.m_floats[1];
                                            local_378[2] = bVar13.m_floats[2];
                                            local_378[3] = bVar13.m_floats[3];
                                            (**(code **)(*(long *)pbVar14->m_floats + 0x20))
                                                      (-local_328[local_f4],pbVar14,local_378,
                                                       &local_368);
                                          }
                                        }
                                        *in_stack_00000018 = local_fc;
                                        local_4 = local_330;
                                      }
                                    }
                                  }
                                  else {
                                    btVector3::btVector3(&local_120);
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(local_10);
                                      bVar7 = pbVar6[local_f0];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_120);
                                      pbVar6[local_f0] = bVar7;
                                    }
                                    for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = dDOT14(pbVar6,local_18 + local_f4);
                                      local_124 = (float)(~-(uint)(0.0 < bVar7) & 0xbf800000 |
                                                         -(uint)(0.0 < bVar7) & 0x3f800000);
                                      for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                        fVar9 = local_124 * local_98[(long)local_f4 + 3];
                                        fVar8 = local_18[local_f0 * 4 + local_f4];
                                        pbVar6 = btVector3::operator_cast_to_float_(&local_120);
                                        pbVar6[local_f0] = fVar9 * fVar8 + pbVar6[local_f0];
                                      }
                                    }
                                    btVector3::btVector3(&local_134);
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(local_28);
                                      bVar7 = pbVar6[local_f0];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_134);
                                      pbVar6[local_f0] = bVar7;
                                    }
                                    for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(in_stack_00000008)
                                      ;
                                      bVar7 = dDOT14(pbVar6,local_30 + local_f4);
                                      local_124 = (float)(~-(uint)(0.0 < bVar7) & 0x3f800000 |
                                                         -(uint)(0.0 < bVar7) & 0xbf800000);
                                      for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                        fVar9 = local_124 * local_98[local_f4];
                                        fVar8 = local_30[local_f0 * 4 + local_f4];
                                        pbVar6 = btVector3::operator_cast_to_float_(&local_134);
                                        pbVar6[local_f0] = fVar9 * fVar8 + pbVar6[local_f0];
                                      }
                                    }
                                    btVector3::btVector3(&local_14c);
                                    btVector3::btVector3(&local_15c);
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      bVar7 = local_18[(local_fc + -7) / 3 + local_f0 * 4];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_14c);
                                      pbVar6[local_f0] = bVar7;
                                    }
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      bVar7 = local_30[(local_fc + -7) % 3 + local_f0 * 4];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_15c);
                                      pbVar6[local_f0] = bVar7;
                                    }
                                    dLineClosestApproach
                                              ((btVector3 *)
                                               CONCAT44(in_stack_fffffffffffff9f4,
                                                        in_stack_fffffffffffff9f0),
                                               (btVector3 *)
                                               CONCAT44(in_stack_fffffffffffff9ec,
                                                        in_stack_fffffffffffff9e8),
                                               in_stack_fffffffffffff9e0,
                                               (btVector3 *)
                                               CONCAT44(in_stack_fffffffffffff9dc,
                                                        in_stack_fffffffffffff9d8),
                                               in_stack_fffffffffffff9d0,
                                               (btScalar *)
                                               CONCAT44(in_stack_fffffffffffff9cc,
                                                        in_stack_fffffffffffff9c8));
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_14c);
                                      fVar9 = local_138;
                                      fVar8 = pbVar6[local_f0];
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_120);
                                      pbVar6[local_f0] = fVar8 * fVar9 + pbVar6[local_f0];
                                    }
                                    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_15c);
                                      bVar7 = pbVar6[local_f0];
                                      fVar8 = local_13c;
                                      pbVar6 = btVector3::operator_cast_to_float_(&local_134);
                                      pbVar6[local_f0] = bVar7 * fVar8 + pbVar6[local_f0];
                                    }
                                    btVector3::btVector3(&local_16c);
                                    local_17c = (btScalar  [4])operator-(in_stack_fffffffffffff980);
                                    (**(code **)(*(long *)in_stack_00000038->m_floats + 0x20))
                                              (-*in_stack_00000010,in_stack_00000038,local_17c,
                                               &local_134);
                                    *in_stack_00000018 = local_fc;
                                    local_4 = 1;
                                  }
                                }
                              }
                              else {
                                local_4 = 0;
                              }
                            }
                            else {
                              local_4 = 0;
                            }
                          }
                          else {
                            local_4 = 0;
                          }
                        }
                        else {
                          local_4 = 0;
                        }
                      }
                      else {
                        local_4 = 0;
                      }
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                  else {
                    local_4 = 0;
                  }
                }
                else {
                  local_4 = 0;
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int dBoxBox2 (const btVector3& p1, const dMatrix3 R1,
	     const btVector3& side1, const btVector3& p2,
	     const dMatrix3 R2, const btVector3& side2,
	     btVector3& normal, btScalar *depth, int *return_code,
		 int maxc, dContactGeom * /*contact*/, int /*skip*/,btDiscreteCollisionDetectorInterface::Result& output)
{
  const btScalar fudge_factor = btScalar(1.05);
  btVector3 p,pp,normalC(0.f,0.f,0.f);
  const btScalar *normalR = 0;
  btScalar A[3],B[3],R11,R12,R13,R21,R22,R23,R31,R32,R33,
    Q11,Q12,Q13,Q21,Q22,Q23,Q31,Q32,Q33,s,s2,l;
  int i,j,invert_normal,code;

  // get vector from centers of box 1 to box 2, relative to box 1
  p = p2 - p1;
  dMULTIPLY1_331 (pp,R1,p);		// get pp = p relative to body 1

  // get side lengths / 2
  A[0] = side1[0]*btScalar(0.5);
  A[1] = side1[1]*btScalar(0.5);
  A[2] = side1[2]*btScalar(0.5);
  B[0] = side2[0]*btScalar(0.5);
  B[1] = side2[1]*btScalar(0.5);
  B[2] = side2[2]*btScalar(0.5);

  // Rij is R1'*R2, i.e. the relative rotation between R1 and R2
  R11 = dDOT44(R1+0,R2+0); R12 = dDOT44(R1+0,R2+1); R13 = dDOT44(R1+0,R2+2);
  R21 = dDOT44(R1+1,R2+0); R22 = dDOT44(R1+1,R2+1); R23 = dDOT44(R1+1,R2+2);
  R31 = dDOT44(R1+2,R2+0); R32 = dDOT44(R1+2,R2+1); R33 = dDOT44(R1+2,R2+2);

  Q11 = btFabs(R11); Q12 = btFabs(R12); Q13 = btFabs(R13);
  Q21 = btFabs(R21); Q22 = btFabs(R22); Q23 = btFabs(R23);
  Q31 = btFabs(R31); Q32 = btFabs(R32); Q33 = btFabs(R33);

  // for all 15 possible separating axes:
  //   * see if the axis separates the boxes. if so, return 0.
  //   * find the depth of the penetration along the separating axis (s2)
  //   * if this is the largest depth so far, record it.
  // the normal vector will be set to the separating axis with the smallest
  // depth. note: normalR is set to point to a column of R1 or R2 if that is
  // the smallest depth normal so far. otherwise normalR is 0 and normalC is
  // set to a vector relative to body 1. invert_normal is 1 if the sign of
  // the normal should be flipped.

#define TST(expr1,expr2,norm,cc) \
  s2 = btFabs(expr1) - (expr2); \
  if (s2 > 0) return 0; \
  if (s2 > s) { \
    s = s2; \
    normalR = norm; \
    invert_normal = ((expr1) < 0); \
    code = (cc); \
  }

  s = -dInfinity;
  invert_normal = 0;
  code = 0;

  // separating axis = u1,u2,u3
  TST (pp[0],(A[0] + B[0]*Q11 + B[1]*Q12 + B[2]*Q13),R1+0,1);
  TST (pp[1],(A[1] + B[0]*Q21 + B[1]*Q22 + B[2]*Q23),R1+1,2);
  TST (pp[2],(A[2] + B[0]*Q31 + B[1]*Q32 + B[2]*Q33),R1+2,3);

  // separating axis = v1,v2,v3
  TST (dDOT41(R2+0,p),(A[0]*Q11 + A[1]*Q21 + A[2]*Q31 + B[0]),R2+0,4);
  TST (dDOT41(R2+1,p),(A[0]*Q12 + A[1]*Q22 + A[2]*Q32 + B[1]),R2+1,5);
  TST (dDOT41(R2+2,p),(A[0]*Q13 + A[1]*Q23 + A[2]*Q33 + B[2]),R2+2,6);

  // note: cross product axes need to be scaled when s is computed.
  // normal (n1,n2,n3) is relative to box 1.
#undef TST
#define TST(expr1,expr2,n1,n2,n3,cc) \
  s2 = btFabs(expr1) - (expr2); \
  if (s2 > SIMD_EPSILON) return 0; \
  l = btSqrt((n1)*(n1) + (n2)*(n2) + (n3)*(n3)); \
  if (l > SIMD_EPSILON) { \
    s2 /= l; \
    if (s2*fudge_factor > s) { \
      s = s2; \
      normalR = 0; \
      normalC[0] = (n1)/l; normalC[1] = (n2)/l; normalC[2] = (n3)/l; \
      invert_normal = ((expr1) < 0); \
      code = (cc); \
    } \
  }

  btScalar fudge2 (1.0e-5f);

  Q11 += fudge2;
  Q12 += fudge2;
  Q13 += fudge2;

  Q21 += fudge2;
  Q22 += fudge2;
  Q23 += fudge2;

  Q31 += fudge2;
  Q32 += fudge2;
  Q33 += fudge2;

  // separating axis = u1 x (v1,v2,v3)
  TST(pp[2]*R21-pp[1]*R31,(A[1]*Q31+A[2]*Q21+B[1]*Q13+B[2]*Q12),0,-R31,R21,7);
  TST(pp[2]*R22-pp[1]*R32,(A[1]*Q32+A[2]*Q22+B[0]*Q13+B[2]*Q11),0,-R32,R22,8);
  TST(pp[2]*R23-pp[1]*R33,(A[1]*Q33+A[2]*Q23+B[0]*Q12+B[1]*Q11),0,-R33,R23,9);

  // separating axis = u2 x (v1,v2,v3)
  TST(pp[0]*R31-pp[2]*R11,(A[0]*Q31+A[2]*Q11+B[1]*Q23+B[2]*Q22),R31,0,-R11,10);
  TST(pp[0]*R32-pp[2]*R12,(A[0]*Q32+A[2]*Q12+B[0]*Q23+B[2]*Q21),R32,0,-R12,11);
  TST(pp[0]*R33-pp[2]*R13,(A[0]*Q33+A[2]*Q13+B[0]*Q22+B[1]*Q21),R33,0,-R13,12);

  // separating axis = u3 x (v1,v2,v3)
  TST(pp[1]*R11-pp[0]*R21,(A[0]*Q21+A[1]*Q11+B[1]*Q33+B[2]*Q32),-R21,R11,0,13);
  TST(pp[1]*R12-pp[0]*R22,(A[0]*Q22+A[1]*Q12+B[0]*Q33+B[2]*Q31),-R22,R12,0,14);
  TST(pp[1]*R13-pp[0]*R23,(A[0]*Q23+A[1]*Q13+B[0]*Q32+B[1]*Q31),-R23,R13,0,15);

#undef TST

  if (!code) return 0;

  // if we get to this point, the boxes interpenetrate. compute the normal
  // in global coordinates.
  if (normalR) {
    normal[0] = normalR[0];
    normal[1] = normalR[4];
    normal[2] = normalR[8];
  }
  else {
    dMULTIPLY0_331 (normal,R1,normalC);
  }
  if (invert_normal) {
    normal[0] = -normal[0];
    normal[1] = -normal[1];
    normal[2] = -normal[2];
  }
  *depth = -s;

  // compute contact point(s)

  if (code > 6) {
    // an edge from box 1 touches an edge from box 2.
    // find a point pa on the intersecting edge of box 1
    btVector3 pa;
    btScalar sign;
    for (i=0; i<3; i++) pa[i] = p1[i];
    for (j=0; j<3; j++) {
      sign = (dDOT14(normal,R1+j) > 0) ? btScalar(1.0) : btScalar(-1.0);
      for (i=0; i<3; i++) pa[i] += sign * A[j] * R1[i*4+j];
    }

    // find a point pb on the intersecting edge of box 2
    btVector3 pb;
    for (i=0; i<3; i++) pb[i] = p2[i];
    for (j=0; j<3; j++) {
      sign = (dDOT14(normal,R2+j) > 0) ? btScalar(-1.0) : btScalar(1.0);
      for (i=0; i<3; i++) pb[i] += sign * B[j] * R2[i*4+j];
    }

    btScalar alpha,beta;
    btVector3 ua,ub;
    for (i=0; i<3; i++) ua[i] = R1[((code)-7)/3 + i*4];
    for (i=0; i<3; i++) ub[i] = R2[((code)-7)%3 + i*4];

    dLineClosestApproach (pa,ua,pb,ub,&alpha,&beta);
    for (i=0; i<3; i++) pa[i] += ua[i]*alpha;
    for (i=0; i<3; i++) pb[i] += ub[i]*beta;

	{
		
		//contact[0].pos[i] = btScalar(0.5)*(pa[i]+pb[i]);
		//contact[0].depth = *depth;
		btVector3 pointInWorld;

#ifdef USE_CENTER_POINT
	    for (i=0; i<3; i++) 
			pointInWorld[i] = (pa[i]+pb[i])*btScalar(0.5);
		output.addContactPoint(-normal,pointInWorld,-*depth);
#else
		output.addContactPoint(-normal,pb,-*depth);

#endif //
		*return_code = code;
	}
    return 1;
  }

  // okay, we have a face-something intersection (because the separating
  // axis is perpendicular to a face). define face 'a' to be the reference
  // face (i.e. the normal vector is perpendicular to this) and face 'b' to be
  // the incident face (the closest face of the other box).

  const btScalar *Ra,*Rb,*pa,*pb,*Sa,*Sb;
  if (code <= 3) {
    Ra = R1;
    Rb = R2;
    pa = p1;
    pb = p2;
    Sa = A;
    Sb = B;
  }
  else {
    Ra = R2;
    Rb = R1;
    pa = p2;
    pb = p1;
    Sa = B;
    Sb = A;
  }

  // nr = normal vector of reference face dotted with axes of incident box.
  // anr = absolute values of nr.
  btVector3 normal2,nr,anr;
  if (code <= 3) {
    normal2[0] = normal[0];
    normal2[1] = normal[1];
    normal2[2] = normal[2];
  }
  else {
    normal2[0] = -normal[0];
    normal2[1] = -normal[1];
    normal2[2] = -normal[2];
  }
  dMULTIPLY1_331 (nr,Rb,normal2);
  anr[0] = btFabs (nr[0]);
  anr[1] = btFabs (nr[1]);
  anr[2] = btFabs (nr[2]);

  // find the largest compontent of anr: this corresponds to the normal
  // for the indident face. the other axis numbers of the indicent face
  // are stored in a1,a2.
  int lanr,a1,a2;
  if (anr[1] > anr[0]) {
    if (anr[1] > anr[2]) {
      a1 = 0;
      lanr = 1;
      a2 = 2;
    }
    else {
      a1 = 0;
      a2 = 1;
      lanr = 2;
    }
  }
  else {
    if (anr[0] > anr[2]) {
      lanr = 0;
      a1 = 1;
      a2 = 2;
    }
    else {
      a1 = 0;
      a2 = 1;
      lanr = 2;
    }
  }

  // compute center point of incident face, in reference-face coordinates
  btVector3 center;
  if (nr[lanr] < 0) {
    for (i=0; i<3; i++) center[i] = pb[i] - pa[i] + Sb[lanr] * Rb[i*4+lanr];
  }
  else {
    for (i=0; i<3; i++) center[i] = pb[i] - pa[i] - Sb[lanr] * Rb[i*4+lanr];
  }

  // find the normal and non-normal axis numbers of the reference box
  int codeN,code1,code2;
  if (code <= 3) codeN = code-1; else codeN = code-4;
  if (codeN==0) {
    code1 = 1;
    code2 = 2;
  }
  else if (codeN==1) {
    code1 = 0;
    code2 = 2;
  }
  else {
    code1 = 0;
    code2 = 1;
  }

  // find the four corners of the incident face, in reference-face coordinates
  btScalar quad[8];	// 2D coordinate of incident face (x,y pairs)
  btScalar c1,c2,m11,m12,m21,m22;
  c1 = dDOT14 (center,Ra+code1);
  c2 = dDOT14 (center,Ra+code2);
  // optimize this? - we have already computed this data above, but it is not
  // stored in an easy-to-index format. for now it's quicker just to recompute
  // the four dot products.
  m11 = dDOT44 (Ra+code1,Rb+a1);
  m12 = dDOT44 (Ra+code1,Rb+a2);
  m21 = dDOT44 (Ra+code2,Rb+a1);
  m22 = dDOT44 (Ra+code2,Rb+a2);
  {
    btScalar k1 = m11*Sb[a1];
    btScalar k2 = m21*Sb[a1];
    btScalar k3 = m12*Sb[a2];
    btScalar k4 = m22*Sb[a2];
    quad[0] = c1 - k1 - k3;
    quad[1] = c2 - k2 - k4;
    quad[2] = c1 - k1 + k3;
    quad[3] = c2 - k2 + k4;
    quad[4] = c1 + k1 + k3;
    quad[5] = c2 + k2 + k4;
    quad[6] = c1 + k1 - k3;
    quad[7] = c2 + k2 - k4;
  }

  // find the size of the reference face
  btScalar rect[2];
  rect[0] = Sa[code1];
  rect[1] = Sa[code2];

  // intersect the incident and reference faces
  btScalar ret[16];
  int n = intersectRectQuad2 (rect,quad,ret);
  if (n < 1) return 0;		// this should never happen

  // convert the intersection points into reference-face coordinates,
  // and compute the contact position and depth for each point. only keep
  // those points that have a positive (penetrating) depth. delete points in
  // the 'ret' array as necessary so that 'point' and 'ret' correspond.
  btScalar point[3*8];		// penetrating contact points
  btScalar dep[8];			// depths for those points
  btScalar det1 = 1.f/(m11*m22 - m12*m21);
  m11 *= det1;
  m12 *= det1;
  m21 *= det1;
  m22 *= det1;
  int cnum = 0;			// number of penetrating contact points found
  for (j=0; j < n; j++) {
    btScalar k1 =  m22*(ret[j*2]-c1) - m12*(ret[j*2+1]-c2);
    btScalar k2 = -m21*(ret[j*2]-c1) + m11*(ret[j*2+1]-c2);
    for (i=0; i<3; i++) point[cnum*3+i] =
			  center[i] + k1*Rb[i*4+a1] + k2*Rb[i*4+a2];
    dep[cnum] = Sa[codeN] - dDOT(normal2,point+cnum*3);
    if (dep[cnum] >= 0) {
      ret[cnum*2] = ret[j*2];
      ret[cnum*2+1] = ret[j*2+1];
      cnum++;
    }
  }
  if (cnum < 1) return 0;	// this should never happen

  // we can't generate more contacts than we actually have
  if (maxc > cnum) maxc = cnum;
  if (maxc < 1) maxc = 1;

  if (cnum <= maxc) {

	  if (code<4) 
	  {
    // we have less contacts than we need, so we use them all
    for (j=0; j < cnum; j++) 
	{
		btVector3 pointInWorld;
		for (i=0; i<3; i++) 
			pointInWorld[i] = point[j*3+i] + pa[i];
		output.addContactPoint(-normal,pointInWorld,-dep[j]);

    }
	  } else
	  {
		  // we have less contacts than we need, so we use them all
		for (j=0; j < cnum; j++) 
		{
			btVector3 pointInWorld;
			for (i=0; i<3; i++) 
				pointInWorld[i] = point[j*3+i] + pa[i]-normal[i]*dep[j];
				//pointInWorld[i] = point[j*3+i] + pa[i];
			output.addContactPoint(-normal,pointInWorld,-dep[j]);
		}
	  }
  }
  else {
    // we have more contacts than are wanted, some of them must be culled.
    // find the deepest point, it is always the first contact.
    int i1 = 0;
    btScalar maxdepth = dep[0];
    for (i=1; i<cnum; i++) {
      if (dep[i] > maxdepth) {
	maxdepth = dep[i];
	i1 = i;
      }
    }

    int iret[8];
    cullPoints2 (cnum,ret,maxc,i1,iret);

    for (j=0; j < maxc; j++) {
//      dContactGeom *con = CONTACT(contact,skip*j);
  //    for (i=0; i<3; i++) con->pos[i] = point[iret[j]*3+i] + pa[i];
    //  con->depth = dep[iret[j]];

		btVector3 posInWorld;
		for (i=0; i<3; i++) 
			posInWorld[i] = point[iret[j]*3+i] + pa[i];
		if (code<4) 
	   {
			output.addContactPoint(-normal,posInWorld,-dep[iret[j]]);
		} else
		{
			output.addContactPoint(-normal,posInWorld-normal*dep[iret[j]],-dep[iret[j]]);
		}
    }
    cnum = maxc;
  }

  *return_code = code;
  return cnum;
}